

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_test.cpp
# Opt level: O0

void __thiscall unit_test::unit_test(unit_test *this,service *s)

{
  service *in_RSI;
  application *in_RDI;
  allocator local_121;
  unit_test *in_stack_fffffffffffffee0;
  member_type in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef8;
  url_dispatcher *in_stack_ffffffffffffff00;
  code *this_00;
  allocator local_e9;
  string local_e8 [32];
  code *local_c8;
  undefined8 local_c0;
  allocator local_b1;
  string local_b0 [32];
  code *local_90;
  undefined8 local_88;
  allocator local_79;
  string local_78 [32];
  code *local_58;
  undefined8 local_50;
  allocator local_41;
  string local_40 [64];
  
  cppcms::application::application(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__unit_test_0010cba8;
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"/ca",&local_41);
  local_58 = compressed_a;
  local_50 = 0;
  cppcms::url_dispatcher::assign<unit_test>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"/cb",&local_79);
  local_90 = compressed_b;
  local_88 = 0;
  cppcms::url_dispatcher::assign<unit_test>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"/cbig",&local_b1);
  local_c8 = compressed_big;
  local_c0 = 0;
  cppcms::url_dispatcher::assign<unit_test>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"/bin",&local_e9);
  this_00 = binary;
  cppcms::url_dispatcher::assign<unit_test>
            ((url_dispatcher *)binary,in_stack_fffffffffffffef8,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffee0,"/not",&local_121);
  cppcms::url_dispatcher::assign<unit_test>
            ((url_dispatcher *)this_00,in_stack_fffffffffffffef8,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  return;
}

Assistant:

unit_test(cppcms::service &s) : cppcms::application(s)
	{
		dispatcher().assign("/ca",&unit_test::compressed_a,this);
		dispatcher().assign("/cb",&unit_test::compressed_b,this);
		dispatcher().assign("/cbig",&unit_test::compressed_big,this);
		dispatcher().assign("/bin",&unit_test::binary,this);
		dispatcher().assign("/not",&unit_test::not_compressed,this);
	}